

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O0

int display_schema(void)

{
  int iVar1;
  cfg_db *pcVar2;
  int local_3c;
  undefined1 local_38 [4];
  int return_code;
  autobuf log;
  
  local_3c = 0;
  abuf_init(local_38);
  pcVar2 = oonf_cfg_get_rawdb();
  iVar1 = cfg_cmd_handle_schema(pcVar2,_schema_name,local_38);
  if (iVar1 != 0) {
    local_3c = -1;
  }
  log._24_8_ = local_38;
  if (log._total != 0) {
    fputs((char *)log._len,_stdout);
  }
  abuf_free(local_38);
  return local_3c;
}

Assistant:

static int
display_schema(void) {
  struct autobuf log;
  int return_code;

  return_code = 0;

  abuf_init(&log);

  if (cfg_cmd_handle_schema(oonf_cfg_get_rawdb(), _schema_name, &log)) {
    return_code = -1;
  }

  if (abuf_getlen(&log) > 0) {
    fputs(abuf_getptr(&log), stdout);
  }

  abuf_free(&log);

  return return_code;
}